

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::DateTimePickerPrivate::setRange
          (DateTimePickerPrivate *this,QDateTime *min,QDateTime *max)

{
  QDateTime *this_00;
  char cVar1;
  QDateTime *this_01;
  
  this_01 = &this->minimum;
  cVar1 = QDateTime::equals(this_01);
  if (cVar1 != '\0') {
    cVar1 = QDateTime::equals(&this->maximum);
    if (cVar1 != '\0') {
      return;
    }
  }
  QDateTime::operator=(this_01,min);
  this_00 = &this->maximum;
  QDateTime::operator=(this_00,max);
  cVar1 = QDateTime::precedes(&this->value);
  if (cVar1 == '\0') {
    cVar1 = QDateTime::precedes(this_00);
    this_01 = this_00;
    if (cVar1 == '\0') goto LAB_0015c11f;
  }
  QDateTime::operator=(&this->value,this_01);
LAB_0015c11f:
  fillValues(this,true);
  QWidget::updateGeometry();
  QWidget::update();
  return;
}

Assistant:

void
DateTimePickerPrivate::setRange( const QDateTime & min, const QDateTime & max )
{
	if( minimum != min || maximum != max )
	{
		minimum = min;
		maximum = max;

		if( value < minimum )
			value = minimum;
		else if( value > maximum )
			value = maximum;

		fillValues();

		q->updateGeometry();
		q->update();
	}
}